

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::TDVertScore::IntroducePropagate
          (TDVertScore *this,shared_ptr<indigox::algorithm::TDVertScore> *a)

{
  MolVertPair v;
  bool bVar1;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_bool>
  pVar3;
  pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ms;
  iterator __end4;
  iterator __begin4;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range4;
  MaskScores tmpScores;
  BagMask newMask;
  pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *bmask;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  uint32_t e_1;
  BagMask iMask;
  size_t i;
  BagScores tmpBags;
  uint32_t e;
  size_t count;
  MolVertPair introduced;
  iterator in_stack_fffffffffffffe08;
  reference in_stack_fffffffffffffe10;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe18;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  in_stack_fffffffffffffe30;
  TDVertScore *in_stack_fffffffffffffe38;
  mapped_type *in_stack_fffffffffffffe40;
  undefined1 *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
  in_stack_fffffffffffffe58;
  _Self local_158;
  _Self local_150;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_148;
  _Base_ptr local_140;
  undefined1 local_138;
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  mapped_type *local_c8;
  uint local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  ulong local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  undefined1 local_60 [52];
  uint local_2c;
  size_type local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40);
  local_18 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x48);
  std::
  __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15b157);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe08._M_node);
  std::
  map<std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::at((map<std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        *)in_stack_fffffffffffffe30._M_node,
       (key_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  local_28 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                       (in_stack_fffffffffffffe20);
  for (local_2c = *(uint *)(in_RDI + 0x40); local_2c <= *(uint *)(in_RDI + 0x44);
      local_2c = local_2c + 1) {
    in_stack_fffffffffffffe48 = local_60;
    std::
    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::map((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           *)0x15b1d1);
    pVar2 = std::
            map<unsigned_int,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
            ::
            emplace<unsigned_int&,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>&>
                      ((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffe20,(uint *)in_stack_fffffffffffffe18,
                       (map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe58 = pVar2.first._M_node;
    in_stack_fffffffffffffe57 = pVar2.second;
    local_80 = in_stack_fffffffffffffe58._M_node;
    local_78 = in_stack_fffffffffffffe57;
    std::
    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::~map((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
            *)0x15b21c);
  }
  for (local_88 = 1; local_88 <= local_28; local_88 = local_88 + 1) {
    local_b8 = local_20;
    local_b0 = local_18;
    v.second = in_stack_fffffffffffffe48;
    v.first = in_stack_fffffffffffffe40;
    IntroduceCountToMask(in_stack_fffffffffffffe38,v,(size_t)in_stack_fffffffffffffe30._M_node);
    for (local_bc = *(uint *)(in_RDI + 0x40); local_bc <= *(uint *)(in_RDI + 0x44);
        local_bc = local_bc + 1) {
      std::
      __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x15b2f2);
      in_stack_fffffffffffffe40 =
           std::
           map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
           ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                 *)in_stack_fffffffffffffe30._M_node,
                (key_type_conflict1 *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28))
      ;
      local_c8 = in_stack_fffffffffffffe40;
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           ::begin(in_stack_fffffffffffffe08._M_node);
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           ::end(in_stack_fffffffffffffe08._M_node);
      while( true ) {
        bVar1 = std::operator!=(&local_d0,&local_d8);
        if (!bVar1) break;
        local_e0 = std::
                   _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                                *)0x15b36f);
        boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffe58._M_node,
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
        std::
        multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::multimap((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)0x15b3a3);
        in_stack_fffffffffffffe38 =
             (TDVertScore *)
             std::
             map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
             ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                   *)in_stack_fffffffffffffe30._M_node,
                  (key_type_conflict1 *)
                  CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        pVar3 = std::
                map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                ::
                emplace<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>&>
                          ((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                            *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           (multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe30 = pVar3.first._M_node;
        in_stack_fffffffffffffe2f = pVar3.second;
        local_148 = &local_e0->second;
        local_140 = in_stack_fffffffffffffe30._M_node;
        local_138 = in_stack_fffffffffffffe2f;
        local_150._M_node =
             (_Base_ptr)
             std::
             multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::begin(in_stack_fffffffffffffe08._M_node);
        local_158._M_node =
             (_Base_ptr)
             std::
             multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::end(in_stack_fffffffffffffe08._M_node);
        while( true ) {
          bVar1 = std::operator!=(&local_150,&local_158);
          if (!bVar1) break;
          in_stack_fffffffffffffe10 =
               std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)0x15b466);
          in_stack_fffffffffffffe20 =
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
               ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffe30._M_node,
                    (key_type_conflict1 *)
                    CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          in_stack_fffffffffffffe18 =
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::at((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffe30._M_node,
                    (key_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffe58._M_node,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
          in_stack_fffffffffffffe08 =
               std::
               multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
               ::
               emplace<unsigned_int_const&,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->first,
                          in_stack_fffffffffffffe08._M_node);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15b4f6);
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffe10);
        }
        std::
        multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~multimap((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)0x15b564);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15b571);
        std::
        _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffe10);
      }
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15b5c4);
  }
  std::
  __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15b5f6);
  std::
  map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
  ::clear((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
           *)0x15b602);
  return;
}

Assistant:

void TDVertScore::IntroducePropagate(std::shared_ptr<TDVertScore> a)
{
  MolVertPair introduced = tdProperties->kind.second;
  fMask = a->fMask;
  size_t count = parent->pairMasks_.at(introduced).count();
  for (uint32_t e = min_e; e <= max_e; ++e) {
    BagScores tmpBags;
    score.emplace(e, tmpBags);
  }
  
  for (size_t i = 1; i <= count; ++i) {
    BagMask iMask = IntroduceCountToMask(introduced, i);
    for (uint32_t e = min_e; e <= max_e; ++e) {
      for (auto& bmask : a->score.at(e)) {
        BagMask newMask = bmask.first | iMask;
        MaskScores tmpScores;
        score.at(e).emplace(newMask, tmpScores);
        for (auto& ms : bmask.second) {
          score.at(e).at(newMask).emplace(ms.first, ms.second | iMask);
        }
      }
    }
  }
  a->score.clear();
}